

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O1

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaCallNode *node)

{
  SymbolTable *pSVar1;
  LambdaNode *pLVar2;
  unsigned_long __val;
  unsigned_long __val_00;
  int iVar3;
  undefined4 extraout_var;
  optional<TypeName> *poVar4;
  mapped_type *pmVar5;
  long *plVar6;
  size_type *psVar7;
  long *plVar8;
  _Self __tmp;
  undefined8 *puVar9;
  TypeChecker typeChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  LambdaCallNode *local_e0;
  SemanticAnalyser *local_d8;
  string local_d0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pLVar2 = (node->lambda_)._M_t.super___uniq_ptr_impl<LambdaNode,_std::default_delete<LambdaNode>_>.
           _M_t.super__Tuple_impl<0UL,_LambdaNode_*,_std::default_delete<LambdaNode>_>.
           super__Head_base<0UL,_LambdaNode_*,_false>._M_head_impl;
  local_e0 = node;
  iVar3 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar6 = (long *)CONCAT44(extraout_var,iVar3);
  __val = (pLVar2->arguments_).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          ._M_impl._M_node._M_size;
  __val_00 = plVar6[2];
  local_d8 = this;
  (**(code **)(*(long *)&(pLVar2->super_ExpressionNode).super_Node + 0x10))(pLVar2,this);
  if (__val != __val_00) {
    std::__cxx11::to_string((string *)local_b0,__val);
    std::operator+(&local_90,"Lambda expected ",(string *)local_b0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_100._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_100._M_dataplus._M_p == psVar7) {
      local_100.field_2._M_allocated_capacity = *psVar7;
      local_100.field_2._8_8_ = plVar6[3];
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = *psVar7;
    }
    local_100._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_50,__val_00);
    std::operator+(&local_70,&local_100,&local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar7) {
      local_d0.field_2._M_allocated_capacity = *psVar7;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar7;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    reportError(&local_d0,(Node *)local_e0);
  }
  plVar8 = (long *)*plVar6;
  if (plVar8 != plVar6) {
    puVar9 = *(undefined8 **)
              &(pLVar2->arguments_).
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
               ._M_impl;
    pSVar1 = &local_d8->symbols_;
    do {
      (**(code **)(*(long *)plVar8[2] + 0x10))((long *)plVar8[2],local_d8);
      local_b0._0_8_ = &PTR__Visitor_00156e60;
      local_b0[0xc] = false;
      local_a0._M_allocated_capacity = (size_type)pSVar1;
      (**(code **)(*(long *)plVar8[2] + 0x10))((long *)plVar8[2],(TypeChecker *)local_b0);
      poVar4 = TypeChecker::getType((TypeChecker *)local_b0);
      if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
          super__Optional_payload_base<TypeName>._M_engaged == true) {
        poVar4 = TypeChecker::getType((TypeChecker *)local_b0);
        if (((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
             super__Optional_payload_base<TypeName>._M_engaged != true) ||
           ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
            super__Optional_payload_base<TypeName>._M_payload._M_value != *(TypeName *)(puVar9 + 6))
           ) {
          pmVar5 = std::__detail::
                   _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&TypeNameStrings_abi_cxx11_,(key_type *)(puVar9 + 6));
          std::operator+(&local_90,"Lambda expected argument of type ",pmVar5);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_100._M_dataplus._M_p = (pointer)*plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar7) {
            local_100.field_2._M_allocated_capacity = *psVar7;
            local_100.field_2._8_8_ = plVar6[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar7;
          }
          local_100._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          poVar4 = TypeChecker::getType((TypeChecker *)local_b0);
          if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
              super__Optional_payload_base<TypeName>._M_engaged != false) {
            pmVar5 = std::__detail::
                     _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&TypeNameStrings_abi_cxx11_,(key_type *)poVar4);
            std::operator+(&local_70,&local_100,pmVar5);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_d0._M_dataplus._M_p = (pointer)*plVar6;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)local_d0._M_dataplus._M_p == psVar7) {
              local_d0.field_2._M_allocated_capacity = *psVar7;
              local_d0.field_2._8_8_ = plVar6[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar7;
            }
            local_d0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            reportError(&local_d0,(Node *)local_e0);
          }
          std::__throw_bad_optional_access();
        }
      }
      puVar9 = (undefined8 *)*puVar9;
      plVar8 = (long *)*plVar8;
    } while (plVar8 != plVar6);
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const LambdaCallNode& node) 
{
  const auto& lambda = node.getLambda();
  const auto& expectedArguments = lambda.getArguments();
  const auto& providedArguments = node.getArguments();
  const auto nExpectedArgs = expectedArguments.size();
  const auto nProvidedArgs = providedArguments.size();

  lambda.accept(*this);

  if(nExpectedArgs != nProvidedArgs)
    reportError("Lambda expected " + std::to_string(nExpectedArgs) + 
      ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);


  auto expectedArgumentIt = expectedArguments.begin();
  for(const auto& arg : providedArguments)
  {
    arg->accept(*this);

    TypeChecker typeChecker{symbols_};
    arg->accept(typeChecker);
    if(typeChecker.getType().has_value() && typeChecker.getType() != expectedArgumentIt->second)
      reportError("Lambda expected argument of type " + 
        TypeNameStrings.at(expectedArgumentIt->second) + ", but got " + 
          TypeNameStrings.at(typeChecker.getType().value()) + "!", node);

    expectedArgumentIt++;
  }
}